

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_interpolate_face
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_INT new_node_local;
  REF_INT node2_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  if ((((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->global[node0] < 0)) ||
       ((node1 < 0 || (ref_node->max <= node1)))) ||
      ((ref_node->global[node1] < 0 || ((node2 < 0 || (ref_node->max <= node2)))))) ||
     (ref_node->global[node2] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa5c,
           "ref_node_interpolate_face",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      ref_node->real[ref_private_macro_code_rss_1 + new_node * 0xf] =
           (ref_node->real[ref_private_macro_code_rss_1 + node0 * 0xf] +
            ref_node->real[ref_private_macro_code_rss_1 + node1 * 0xf] +
           ref_node->real[ref_private_macro_code_rss_1 + node2 * 0xf]) * 0.3333333333333333;
    }
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node->naux;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      ref_node->aux[ref_private_macro_code_rss_1 + ref_node->naux * new_node] =
           (ref_node->aux[ref_private_macro_code_rss_1 + ref_node->naux * node0] +
            ref_node->aux[ref_private_macro_code_rss_1 + ref_node->naux * node1] +
           ref_node->aux[ref_private_macro_code_rss_1 + ref_node->naux * node2]) *
           0.3333333333333333;
    }
    ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node0,log_m1 + 5);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node1,log_m2 + 5);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node2,log_m + 5);
        if (ref_node_local._4_4_ == 0) {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            *(double *)(&ref_private_macro_code_rss + (long)ref_private_macro_code_rss_1 * 2) =
                 (log_m1[(long)ref_private_macro_code_rss_1 + 5] +
                  log_m2[(long)ref_private_macro_code_rss_1 + 5] +
                 log_m[(long)ref_private_macro_code_rss_1 + 5]) * 0.3333333333333333;
          }
          ref_node_local._4_4_ =
               ref_node_metric_set_log(ref_node,new_node,(REF_DBL *)&ref_private_macro_code_rss);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xa71,"ref_node_interpolate_face",(ulong)ref_node_local._4_4_,"log new");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xa6c,"ref_node_interpolate_face",(ulong)ref_node_local._4_4_,"log 2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xa6b,"ref_node_interpolate_face",(ulong)ref_node_local._4_4_,"log 1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa6a,
             "ref_node_interpolate_face",(ulong)ref_node_local._4_4_,"log 0");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_face(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1, REF_INT node2,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_INT i;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1) ||
      !ref_node_valid(ref_node, node2))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_xyz(ref_node, i, node0) + ref_node_xyz(ref_node, i, node1) +
         ref_node_xyz(ref_node, i, node2));

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_aux(ref_node, i, node0) + ref_node_aux(ref_node, i, node1) +
         ref_node_aux(ref_node, i, node2));

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");
  RSS(ref_node_metric_get_log(ref_node, node2, log_m2), "log 2");

  for (i = 0; i < 6; i++)
    log_m[i] = (1.0 / 3.0) * (log_m0[i] + log_m1[i] + log_m2[i]);

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}